

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O3

sc_signed * sc_dt::operator&(sc_signed *__return_storage_ptr__,long u,sc_signed *v)

{
  int vs;
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  sc_length_param *psVar4;
  ulong uVar5;
  size_t __n;
  sc_digit ud [3];
  
  if ((u == 0) || (vs = v->sgn, vs == 0)) {
    psVar4 = sc_context<sc_dt::sc_length_param>::default_value();
    sc_signed::sc_signed(__return_storage_ptr__,psVar4->m_len);
  }
  else {
    uVar5 = -u;
    if ((ulong)u < 0x8000000000000001) {
      uVar5 = 0x8000000000000000;
    }
    if (0 < u) {
      uVar5 = u;
    }
    __n = 0xc;
    uVar2 = 0;
    do {
      uVar3 = uVar2;
      ud[uVar3] = (uint)uVar5 & 0x3fffffff;
      __n = __n - 4;
      if (1 < uVar3) break;
      bVar1 = 0x3fffffff < uVar5;
      uVar2 = uVar3 + 1;
      uVar5 = uVar5 >> 0x1e;
    } while (bVar1);
    if (uVar3 < 2) {
      memset(ud + uVar3 + 1,0,__n);
    }
    and_signed_friend(__return_storage_ptr__,(uint)(0 < u) * 2 + -1,0x40,3,ud,vs,v->nbits,v->ndigits
                      ,v->digit);
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator&(long u, const sc_signed& v)
{

  if ((u == 0) || (v.sgn == SC_ZERO)) // case 1
    return sc_signed();

  CONVERT_LONG(u);

  // other cases
  return and_signed_friend(us, BITS_PER_ULONG, DIGITS_PER_ULONG, ud,
                           v.sgn, v.nbits, v.ndigits, v.digit);

}